

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void pack_cell(cellp *p,vector<int,_std::allocator<int>_> *particle_numbers,size_t *pn_index,
              vector<particle,_std::allocator<particle>_> *particles,size_t *p_index)

{
  int *piVar1;
  double *pdVar2;
  size_t sVar3;
  particle *ppVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 uVar17;
  particle *ppVar18;
  particle *ppVar19;
  pointer ppVar20;
  ulong uVar21;
  ulong uVar22;
  
  sVar3 = *pn_index;
  ppVar4 = (p->pl).head;
  (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start[sVar3] = 0;
  while (ppVar4 != (particle *)0x0) {
    ppVar20 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar22 = *p_index;
    uVar21 = ((long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppVar20 >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (uVar21 < uVar22 || uVar21 - uVar22 == 0) {
      std::vector<particle,_std::allocator<particle>_>::resize(particles,uVar21 + 1 + (uVar21 >> 1))
      ;
      uVar22 = *p_index;
      ppVar20 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    *p_index = uVar22 + 1;
    dVar5 = ppVar4->x;
    dVar6 = ppVar4->y;
    dVar7 = ppVar4->z;
    dVar8 = ppVar4->ux;
    dVar9 = ppVar4->uy;
    dVar10 = ppVar4->uz;
    dVar11 = ppVar4->g;
    dVar12 = ppVar4->q;
    dVar13 = ppVar4->g;
    dVar14 = ppVar4->q;
    dVar15 = ppVar4->cmr;
    dVar16 = ppVar4->chi;
    uVar17 = *(undefined8 *)&ppVar4->trn;
    ppVar18 = ppVar4->next;
    ppVar19 = ppVar4->previous;
    pdVar2 = &ppVar20[uVar22].uz;
    *pdVar2 = ppVar4->uz;
    pdVar2[1] = dVar13;
    pdVar2[2] = dVar14;
    pdVar2[3] = dVar15;
    pdVar2[4] = dVar16;
    pdVar2[5] = (double)uVar17;
    pdVar2[6] = (double)ppVar18;
    pdVar2[7] = (double)ppVar19;
    ppVar20 = ppVar20 + uVar22;
    ppVar20->x = dVar5;
    ppVar20->y = dVar6;
    ppVar20->z = dVar7;
    ppVar20->ux = dVar8;
    ppVar20->uy = dVar9;
    ppVar20->uz = dVar10;
    ppVar20->g = dVar11;
    ppVar20->q = dVar12;
    sVar3 = *pn_index;
    ppVar4 = ppVar4->next;
    piVar1 = (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + sVar3;
    *piVar1 = *piVar1 + 1;
  }
  *pn_index = sVar3 + 1;
  return;
}

Assistant:

void pack_cell(cellp & p, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    particle* current = p.pl.head;
    particle_numbers[pn_index] = 0;
    while (current != 0) {
        if (particles.size() <= p_index) {
            particles.resize(3 * particles.size() / 2 + 1);
        }
        particles[p_index++] = *current;

        current = current->next;
        particle_numbers[pn_index]++;
    }
    pn_index++;
}